

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void __thiscall depspawn::internal::TaskPool::Task::run(Task *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  function<void_()> *in_RDI;
  long *in_FS_OFFSET;
  Workitem *prev_enum_thr_spec_father;
  Workitem **ref_father_lcl;
  
  if (*(long *)&in_RDI[1].super__Function_base._M_functor == 0) {
    std::function<void_()>::operator()(in_RDI);
  }
  else {
    *(undefined2 *)(*(long *)&in_RDI[1].super__Function_base._M_functor + 8) = 3;
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -8);
    uVar2 = *puVar1;
    *puVar1 = *(undefined8 *)&in_RDI[1].super__Function_base._M_functor;
    std::function<void_()>::operator()(in_RDI);
    *puVar1 = uVar2;
    (**(code **)(**(long **)&in_RDI[1].super__Function_base._M_functor + 0x10))();
  }
  return;
}

Assistant:

void TaskPool::Task::run()
  {
    if (ctx_) {
      ctx_->status = Workitem::Status_t::Running;

      Workitem *& ref_father_lcl = enum_thr_spec_father;
      Workitem * const prev_enum_thr_spec_father = ref_father_lcl;
      ref_father_lcl = ctx_;

      func_();

      ref_father_lcl = prev_enum_thr_spec_father;

      ctx_->finish_execution();
    } else {
      func_();
    }
  }